

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O1

bool __thiscall
QEventDispatcherUNIX::processEvents(QEventDispatcherUNIX *this,ProcessEventsFlags flags)

{
  QList<pollfd> *this_00;
  qsizetype *pqVar1;
  QEventDispatcherUNIXPrivate *this_01;
  QThreadData *data;
  Entry *pEVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  pointer fds;
  iterator iVar8;
  undefined8 uVar9;
  pollfd pVar10;
  qsizetype asize;
  uint uVar11;
  byte bVar12;
  Data *pDVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar15;
  QDeadlineTimer deadline;
  QDeadlineTimer local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QEventDispatcherUNIXPrivate **)(this + 8);
  (this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QAbstractEventDispatcher::awake((QAbstractEventDispatcher *)this);
  data = (this_01->super_QAbstractEventDispatcherPrivate).super_QObjectPrivate.threadData.
         super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p;
  bVar12 = 0;
  QCoreApplicationPrivate::sendPostedEvents((QObject *)0x0,0,data);
  bVar5 = QThreadData::canWaitLocked(data);
  if (bVar5) {
    bVar12 = (this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0 &
             (byte)(((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                           super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 4) >> 2);
  }
  if (bVar12 != 0) {
    QAbstractEventDispatcher::aboutToBlock((QAbstractEventDispatcher *)this);
  }
  if ((this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 0) {
    bVar5 = false;
    goto LAB_003ce830;
  }
  uVar9._0_4_ = 0;
  uVar9._4_4_ = 1;
  pVar10.fd = 0;
  pVar10.events = 0;
  pVar10.revents = 0;
  if (bVar12 != 0) {
    pVar10.fd = -1;
    pVar10.events = -1;
    pVar10.revents = 0x7fff;
  }
  if ((((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
              super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) == 0 & bVar12) == 1) {
    oVar15 = QTimerInfoList::timerWait(&this_01->timerList);
    if (((undefined1  [16])
         oVar15.
         super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_48.t1._0_4_ = -1;
      local_48.t1._4_2_ = -1;
      local_48.t1._6_2_ = 0x7fff;
      local_48.t2 = 0;
      local_48.type = 1;
      uVar9 = local_48._8_8_;
      pVar10 = (pollfd)local_48.t1;
    }
    else {
      local_48.t1._0_4_ = 0;
      local_48.t1._4_2_ = 0;
      local_48.t1._6_2_ = 0;
      local_48.t2 = 0;
      local_48.type = 1;
      if (oVar15.
          super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          _M_payload ==
          (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)
          0x7fffffffffffffff) {
        local_48.t1._0_4_ = -1;
        local_48.t1._4_2_ = -1;
        local_48.t1._6_2_ = 0x7fff;
        local_48.t2 = 0;
        local_48.type = 1;
        uVar9 = local_48._8_8_;
        pVar10 = (pollfd)local_48.t1;
      }
      else {
        QDeadlineTimer::setPreciseRemainingTime
                  (&local_48,0,
                   (qint64)oVar15.
                           super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           ._M_payload,CoarseTimer);
        uVar9 = local_48._8_8_;
        pVar10 = (pollfd)local_48.t1;
      }
    }
  }
  this_00 = &this_01->pollfds;
  QList<pollfd>::clear(this_00);
  if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
             super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 2) == 0) {
    pDVar13 = (this_01->socketNotifiers).d;
    if (pDVar13 == (Data *)0x0) {
      asize = 1;
    }
    else {
      asize = pDVar13->size + 1;
    }
    QList<pollfd>::reserve(this_00,asize);
    pDVar13 = (this_01->socketNotifiers).d;
    if (pDVar13 == (Data *)0x0) {
      pDVar13 = (Data *)0x0;
LAB_003ce69a:
      uVar14 = 0;
    }
    else {
      if (pDVar13->spans->offsets[0] != 0xff) goto LAB_003ce69a;
      uVar4 = 1;
      do {
        uVar14 = uVar4;
        if (pDVar13->numBuckets == uVar14) {
          pDVar13 = (Data *)0x0;
          uVar14 = 0;
          break;
        }
        uVar4 = uVar14 + 1;
      } while (pDVar13->spans[uVar14 >> 7].offsets[(uint)uVar14 & 0x7f] == 0xff);
    }
    if (pDVar13 != (Data *)0x0 || uVar14 != 0) {
      do {
        pEVar2 = pDVar13->spans[uVar14 >> 7].entries;
        bVar12 = pDVar13->spans[uVar14 >> 7].offsets[(uint)uVar14 & 0x7f];
        bVar5 = *(long *)(pEVar2[bVar12].storage.data + 8) != 0;
        uVar11 = bVar5 + 4;
        if (*(long *)(pEVar2[bVar12].storage.data + 0x10) == 0) {
          uVar11 = (uint)bVar5;
        }
        uVar3 = uVar11 + 2;
        if (*(long *)(pEVar2[bVar12].storage.data + 0x18) == 0) {
          uVar3 = uVar11;
        }
        local_48.t1 = CONCAT44(uVar3,*(undefined4 *)pEVar2[bVar12].storage.data);
        QtPrivate::QPodArrayOps<pollfd>::emplace<pollfd>
                  ((QPodArrayOps<pollfd> *)this_00,(this_01->pollfds).d.size,(pollfd *)&local_48);
        QList<pollfd>::end(this_00);
        do {
          if (pDVar13->numBuckets - 1 == uVar14) {
            pDVar13 = (Data *)0x0;
            uVar14 = 0;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (pDVar13->spans[uVar14 >> 7].offsets[(uint)uVar14 & 0x7f] == 0xff);
      } while ((pDVar13 != (Data *)0x0) || (uVar14 != 0));
    }
  }
  else {
    QList<pollfd>::reserve(this_00,1);
  }
  local_48.t1 = (ulong)*(uint *)&(this_01->super_QAbstractEventDispatcherPrivate).field_0x94 |
                0x100000000;
  QtPrivate::QPodArrayOps<pollfd>::emplace<pollfd>
            ((QPodArrayOps<pollfd> *)this_00,(this_01->pollfds).d.size,(pollfd *)&local_48);
  QList<pollfd>::end(this_00);
  fds = QList<pollfd>::data(this_00);
  deadline.t2 = (uint)uVar9;
  deadline.type = SUB84(uVar9,4);
  deadline.t1._0_4_ = pVar10.fd;
  deadline.t1._4_2_ = pVar10.events;
  deadline.t1._6_2_ = pVar10.revents;
  iVar6 = qt_safe_poll(fds,(this_01->pollfds).d.size,deadline);
  if (iVar6 != 0) {
    if (iVar6 == -1) {
      iVar6 = 0;
      qErrnoWarning("qt_safe_poll");
    }
    else {
      iVar8 = QList<pollfd>::end(this_00);
      local_48.t1 = *(qint64 *)(iVar8.i + -1);
      pqVar1 = &(this_01->pollfds).d.size;
      *pqVar1 = *pqVar1 + -1;
      iVar6 = QThreadPipe::check((QThreadPipe *)
                                 &(this_01->super_QAbstractEventDispatcherPrivate).field_0x94,
                                 (pollfd *)&local_48);
      if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                 super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 2) == 0) {
        iVar7 = QEventDispatcherUNIXPrivate::activateSocketNotifiers(this_01);
        iVar6 = iVar6 + iVar7;
      }
    }
  }
  if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
             super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) == 0) {
    iVar7 = QTimerInfoList::activateTimers(&this_01->timerList);
    iVar6 = iVar6 + iVar7;
  }
  bVar5 = 0 < iVar6;
LAB_003ce830:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QEventDispatcherUNIX::processEvents(QEventLoop::ProcessEventsFlags flags)
{
    Q_D(QEventDispatcherUNIX);
    d->interrupt.storeRelaxed(0);

    // we are awake, broadcast it
    emit awake();

    auto threadData = d->threadData.loadRelaxed();
    QCoreApplicationPrivate::sendPostedEvents(nullptr, 0, threadData);

    const bool include_timers = (flags & QEventLoop::X11ExcludeTimers) == 0;
    const bool include_notifiers = (flags & QEventLoop::ExcludeSocketNotifiers) == 0;
    const bool wait_for_events = (flags & QEventLoop::WaitForMoreEvents) != 0;

    const bool canWait = (threadData->canWaitLocked()
                          && !d->interrupt.loadRelaxed()
                          && wait_for_events);

    if (canWait)
        emit aboutToBlock();

    if (d->interrupt.loadRelaxed())
        return false;

    QDeadlineTimer deadline;
    if (canWait) {
        if (include_timers) {
            std::optional<nanoseconds> remaining = d->timerList.timerWait();
            deadline = remaining ? QDeadlineTimer{*remaining}
                             : QDeadlineTimer(QDeadlineTimer::Forever);
        } else {
            deadline = QDeadlineTimer(QDeadlineTimer::Forever);
        }
    } else {
        // Using the default-constructed `deadline`, which is already expired,
        // ensures the code in the do-while loop in qt_safe_poll runs at least once.
    }

    d->pollfds.clear();
    d->pollfds.reserve(1 + (include_notifiers ? d->socketNotifiers.size() : 0));

    if (include_notifiers)
        for (auto it = d->socketNotifiers.cbegin(); it != d->socketNotifiers.cend(); ++it)
            d->pollfds.append(qt_make_pollfd(it.key(), it.value().events()));

    // This must be last, as it's popped off the end below
    d->pollfds.append(d->threadPipe.prepare());

    int nevents = 0;
    switch (qt_safe_poll(d->pollfds.data(), d->pollfds.size(), deadline)) {
    case -1:
        qErrnoWarning("qt_safe_poll");
        if (QT_CONFIG(poll_exit_on_error))
            abort();
        break;
    case 0:
        break;
    default:
        nevents += d->threadPipe.check(d->pollfds.takeLast());
        if (include_notifiers)
            nevents += d->activateSocketNotifiers();
        break;
    }

    if (include_timers)
        nevents += d->activateTimers();

    // return true if we handled events, false otherwise
    return (nevents > 0);
}